

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpmux.c
# Opt level: O0

int WriteData(char *filename,WebPData *webpdata)

{
  int iVar1;
  size_t sVar2;
  undefined8 *in_RSI;
  char *in_RDI;
  FILE *fout;
  int ok;
  FILE *local_30;
  uint local_1c;
  uint local_4;
  
  iVar1 = strcmp(in_RDI,"-");
  if (iVar1 == 0) {
    local_30 = (FILE *)ImgIoUtilSetBinaryMode((FILE *)_stdout);
  }
  else {
    local_30 = fopen(in_RDI,"wb");
  }
  if (local_30 == (FILE *)0x0) {
    fprintf(_stderr,"Error opening output WebP file %s!\n",in_RDI);
    local_4 = 0;
  }
  else {
    sVar2 = fwrite((void *)*in_RSI,in_RSI[1],1,local_30);
    if (sVar2 == 1) {
      fprintf(_stderr,"Saved file %s (%d bytes)\n",in_RDI,in_RSI[1] & 0xffffffff);
    }
    else {
      fprintf(_stderr,"Error writing file %s!\n",in_RDI);
    }
    local_1c = (uint)(sVar2 == 1);
    if (local_30 != _stdout) {
      fclose(local_30);
    }
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

static int WriteData(const char* filename, const WebPData* const webpdata) {
  int ok = 0;
  FILE* fout = WSTRCMP(filename, "-") ? WFOPEN(filename, "wb")
                                      : ImgIoUtilSetBinaryMode(stdout);
  if (fout == NULL) {
    WFPRINTF(stderr, "Error opening output WebP file %s!\n",
             (const W_CHAR*)filename);
    return 0;
  }
  if (fwrite(webpdata->bytes, webpdata->size, 1, fout) != 1) {
    WFPRINTF(stderr, "Error writing file %s!\n", (const W_CHAR*)filename);
  } else {
    WFPRINTF(stderr, "Saved file %s (%d bytes)\n",
             (const W_CHAR*)filename, (int)webpdata->size);
    ok = 1;
  }
  if (fout != stdout) fclose(fout);
  return ok;
}